

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

dict_match * __thiscall
lzham::search_accelerator::find_matches(search_accelerator *this,uint lookahead_ofs,bool spin)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  dict_match *pdVar5;
  int iVar6;
  
  uVar1 = this->m_lookahead_pos;
  uVar2 = this->m_fill_lookahead_pos;
  uVar4 = 0;
  while( true ) {
    uVar3 = (this->m_match_refs).m_p[(lookahead_ofs + uVar1) - uVar2];
    iVar6 = (int)uVar3;
    if (iVar6 != -1) break;
    if (uVar4 < 999 && spin) {
      uVar4 = uVar4 + 1;
    }
    else {
      lzham_sleep(1);
      uVar4 = 1000;
    }
  }
  if (iVar6 == -2) {
    pdVar5 = (dict_match *)0x0;
  }
  else {
    pdVar5 = (this->m_matches).m_p + (uVar3 & 0xffffffff);
  }
  return pdVar5;
}

Assistant:

dict_match* search_accelerator::find_matches(uint lookahead_ofs, bool spin)
   {
      LZHAM_ASSERT(lookahead_ofs < m_lookahead_size);

      const uint match_ref_ofs = static_cast<uint>(m_lookahead_pos - m_fill_lookahead_pos + lookahead_ofs);

      int match_ref;
      uint spin_count = 0;

      for ( ; ; )
      {
         match_ref = m_match_refs[match_ref_ofs];
         if (match_ref == -2)
            return NULL;
         else if (match_ref != -1)
            break;

         spin_count++;
         const uint cMaxSpinCount = 1000;
         if ((spin) && (spin_count < cMaxSpinCount))
         {
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();

            LZHAM_MEMORY_IMPORT_BARRIER
         }
         else
         {
            spin_count = cMaxSpinCount;

            lzham_sleep(1);
         }
      }

      LZHAM_MEMORY_IMPORT_BARRIER

      return &m_matches[match_ref];
   }